

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O3

void print_usage(string *exec_name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  pointer local_28;
  size_type sStack_20;
  
  local_28 = (exec_name->_M_dataplus)._M_p;
  sStack_20 = exec_name->_M_string_length;
  format_str.size_ = 0x34;
  format_str.data_ = "Usage: {} [option] /path/to/database /path/to/index\n";
  args.
  super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        *)&local_28;
  args.
  super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  .types_ = 0xe;
  fmt::v6::vprint(_stderr,format_str,args);
  local_28 = (pointer)0x0;
  format_str_00.size_ = 0x3c;
  format_str_00.data_ = "    [-w <workers>]     number of workers to use, default: 4\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_28;
  fmt::v6::vprint(_stderr,format_str_00,(format_args)(auVar1 << 0x40));
  local_28 = (pointer)0x0;
  format_str_01.size_ = 0x42;
  format_str_01.data_ = "    [-b <batch_size>]  number of samples per batch, default: 1000\n";
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_28;
  fmt::v6::vprint(_stderr,format_str_01,(format_args)(auVar2 << 0x40));
  local_28 = (pointer)0x0;
  format_str_02.size_ = 0x56;
  format_str_02.data_ =
       "    [-i <index_type>]  (multi) type of index, default: gram3, text4, wide8, and hash4\n";
  auVar3._8_8_ = 0;
  auVar3._0_8_ = &local_28;
  fmt::v6::vprint(_stderr,format_str_02,(format_args)(auVar3 << 0x40));
  local_28 = (pointer)0x0;
  format_str_03.size_ = 0x46;
  format_str_03.data_ = "    [-t <tag>]         (multi) tag to apply to samples, default: none\n";
  auVar4._8_8_ = 0;
  auVar4._0_8_ = &local_28;
  fmt::v6::vprint(_stderr,format_str_03,(format_args)(auVar4 << 0x40));
  return;
}

Assistant:

void print_usage(const std::string &exec_name) {
    // clang-format off
    fmt::print(stderr, "Usage: {} [option] /path/to/database /path/to/index\n", exec_name);
    fmt::print(stderr, "    [-w <workers>]     number of workers to use, default: 4\n");
    fmt::print(stderr, "    [-b <batch_size>]  number of samples per batch, default: 1000\n");
    fmt::print(stderr, "    [-i <index_type>]  (multi) type of index, default: gram3, text4, wide8, and hash4\n");
    fmt::print(stderr, "    [-t <tag>]         (multi) tag to apply to samples, default: none\n");
    // clang-format on
}